

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,char **variable,string *value)

{
  char *__dest;
  
  if (*variable != (char *)0x0) {
    operator_delete__(*variable);
    *variable = (char *)0x0;
  }
  __dest = (char *)operator_new__(value->_M_string_length + 1);
  *variable = __dest;
  strcpy(__dest,(value->_M_dataplus)._M_p);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  char** variable, const std::string& value)
{
  if ( *variable )
    {
    delete [] *variable;
    *variable = 0;
    }
  *variable = new char[ value.size() + 1 ];
  strcpy(*variable, value.c_str());
}